

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::makeFineMask_doit<amrex::FArrayBox>
               (FabArray<amrex::FArrayBox> *mask,BoxArray *fba,IntVect *ratio,Periodicity *period,
               value_type_conflict1 crse_value,value_type_conflict1 fine_value)

{
  int iVar1;
  bool bVar2;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  Box *b;
  pair<int,_amrex::Box> *is;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range4;
  IntVect *iv;
  const_iterator __end3;
  const_iterator __begin3;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range3;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FArrayBox *fab;
  Array4<double> *arr;
  Box *bx;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  BoxArray *cfba;
  bool run_on_gpu;
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> tags;
  MFIter *in_stack_fffffffffffffbf8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc08;
  BARef *in_stack_fffffffffffffc10;
  BoxArray *in_stack_fffffffffffffc18;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> _Var3;
  undefined8 in_stack_fffffffffffffc20;
  uchar flags_;
  MFIter *bx_00;
  FabArrayBase *in_stack_fffffffffffffc28;
  MFIter *in_stack_fffffffffffffc30;
  Box *in_stack_fffffffffffffc38;
  BoxArray *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  undefined1 local_374 [28];
  undefined1 *local_358;
  reference local_350;
  pair<int,_amrex::Box> *local_348;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_340;
  undefined1 *local_338;
  undefined1 local_32c [76];
  element_type *local_2e0;
  int local_2d8;
  element_type *local_2cc;
  int local_2c4;
  FabArrayBase *local_2c0;
  int local_2b8;
  FabArrayBase *local_2b0;
  int local_2a8;
  FArrayBox *local_2a0;
  undefined1 local_298 [104];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  MFIter local_228;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [24];
  undefined1 *local_198;
  undefined1 local_180 [200];
  int local_b8;
  RefID local_b0;
  int local_a4;
  int iStack_a0;
  int local_9c;
  element_type *local_98;
  int local_90;
  DataAllocator local_88;
  int local_80;
  int iStack_7c;
  int local_78;
  undefined4 local_74;
  _Atomic_word *local_70;
  undefined4 local_64;
  _Atomic_word *local_60;
  undefined4 local_54;
  MultiArray4<const_double> local_50;
  undefined4 local_44;
  BARef *local_40;
  undefined4 local_34;
  BARef *local_30;
  undefined4 local_24;
  BARef *local_20;
  int local_14;
  int local_10;
  int local_c;
  __uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_8;
  
  flags_ = (uchar)((ulong)in_stack_fffffffffffffc20 >> 0x38);
  local_180._152_8_ = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::Vector
            ((Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> *)
             0x10434c6);
  local_180[0x77] = Gpu::inLaunchRegion();
  coarsen(in_stack_fffffffffffffc18,(IntVect *)in_stack_fffffffffffffc10);
  local_180._104_8_ = local_180;
  Periodicity::shiftIntVect
            ((Periodicity *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  local_198 = local_1b0;
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0x1043535);
  MFIter::MFIter(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,flags_);
  while (bVar2 = MFIter::isValid(&local_228), bVar2) {
    in_stack_fffffffffffffc10 = (BARef *)(local_298 + 0x4c);
    bx_00 = &local_228;
    MFIter::fabbox((MFIter *)in_stack_fffffffffffffc10);
    _Var3._M_head_impl = (FabArray<amrex::FArrayBox> *)local_298;
    local_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffc10;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffc08,(MFIter *)in_stack_fffffffffffffc00);
    local_298._64_8_ = _Var3._M_head_impl;
    local_2a0 = FabArray<amrex::FArrayBox>::operator[]
                          (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    local_b0.data = (BARef *)local_230._M_pi;
    local_20 = (BARef *)local_230._M_pi;
    local_24 = 0;
    local_a4 = *(int *)&((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                        &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                          &(local_230._M_pi)->_vptr__Sp_counted_base)->
                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_start)->_M_head_impl;
    local_30 = (BARef *)local_230._M_pi;
    local_34 = 1;
    iStack_a0 = *(int *)((long)&((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                                &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  &(local_230._M_pi)->_vptr__Sp_counted_base)->
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start)->_M_head_impl + 4);
    local_2c0 = ((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                  &(local_230._M_pi)->_vptr__Sp_counted_base)->
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start)->_M_head_impl;
    local_40 = (BARef *)local_230._M_pi;
    local_44 = 2;
    local_2b8 = (local_230._M_pi)->_M_use_count;
    local_88.m_arena = (Arena *)local_230._M_pi;
    local_50.hp = (Array4<const_double> *)&(local_230._M_pi)->_M_weak_count;
    local_54 = 0;
    local_80 = *(int *)local_50.hp;
    local_60 = &(local_230._M_pi)->_M_weak_count;
    local_64 = 1;
    iStack_7c = *(int *)&local_230._M_pi[1]._vptr__Sp_counted_base;
    local_2e0 = *(element_type **)local_50.hp;
    local_70 = &(local_230._M_pi)->_M_weak_count;
    local_74 = 2;
    local_2d8 = *(int *)((long)&local_230._M_pi[1]._vptr__Sp_counted_base + 4);
    for (local_32c._72_4_ = local_2b8; iVar1 = iStack_a0, (int)local_32c._72_4_ <= local_2d8;
        local_32c._72_4_ = local_32c._72_4_ + 1) {
      while (local_32c._68_4_ = iVar1, iVar1 = local_a4, (int)local_32c._68_4_ <= iStack_7c) {
        while (local_32c._64_4_ = iVar1, (int)local_32c._64_4_ <= local_80) {
          local_8._M_t.
          super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
               (tuple<amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                )(tuple<amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                  )local_298._64_8_;
          local_c = local_32c._64_4_;
          local_10 = local_32c._68_4_;
          local_14 = local_32c._72_4_;
          *(undefined8 *)
           (*(long *)local_298._64_8_ +
           ((long)(local_32c._64_4_ - *(int *)(local_298._64_8_ + 0x20)) +
            (long)(local_32c._68_4_ - *(int *)(local_298._64_8_ + 0x24)) *
            *(long *)&((BoxArray *)(local_298._64_8_ + 8))->m_bat +
           (long)(local_32c._72_4_ - *(int *)(local_298._64_8_ + 0x28)) *
           *(long *)(local_298._64_8_ + 0x10)) * 8) = local_180._152_8_;
          iVar1 = local_32c._64_4_ + 1;
        }
        iVar1 = local_32c._68_4_ + 1;
      }
    }
    local_32c._52_8_ = local_198;
    local_2cc = local_2e0;
    local_2c4 = local_2d8;
    local_2b0 = local_2c0;
    local_2a8 = local_2b8;
    local_180._192_8_ = local_2c0;
    local_b8 = local_2b8;
    local_9c = local_2b8;
    local_98 = local_2e0;
    local_90 = local_2d8;
    local_78 = local_2d8;
    local_32c._44_8_ =
         std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                   ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                    in_stack_fffffffffffffbf8);
    local_32c._36_8_ =
         std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                   ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                    in_stack_fffffffffffffbf8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                               *)in_stack_fffffffffffffc00,
                              (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                               *)in_stack_fffffffffffffbf8), bVar2) {
      local_32c._28_8_ =
           __gnu_cxx::
           __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
           ::operator*((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                        *)(local_32c + 0x2c));
      in_stack_fffffffffffffc08 = (FabArray<amrex::FArrayBox> *)local_32c;
      in_stack_fffffffffffffc00 = (FabArray<amrex::FArrayBox> *)local_180._104_8_;
      Box::operator+((Box *)local_180._104_8_,(IntVect *)in_stack_fffffffffffffbf8);
      BoxArray::intersections
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffc30);
      local_338 = local_1c8;
      local_340._M_current =
           (pair<int,_amrex::Box> *)
           std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
           begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffbf8);
      local_348 = (pair<int,_amrex::Box> *)
                  std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       *)in_stack_fffffffffffffbf8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                 *)in_stack_fffffffffffffc00,
                                (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                 *)in_stack_fffffffffffffbf8), bVar2) {
        local_350 = __gnu_cxx::
                    __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                    ::operator*(&local_340);
        Box::operator-((Box *)in_stack_fffffffffffffc00,(IntVect *)in_stack_fffffffffffffbf8);
        local_358 = local_374;
        if ((local_180[0x77] & 1) == 0) {
          BaseFab<double>::setVal<(amrex::RunOn)1>
                    ((BaseFab<double> *)in_stack_fffffffffffffc30,
                     (double *)in_stack_fffffffffffffc28,(Box *)bx_00,
                     (int)((ulong)_Var3._M_head_impl >> 0x20));
        }
        else {
          in_stack_fffffffffffffc28 = *(FabArrayBase **)local_298._64_8_;
          in_stack_fffffffffffffc30 = *(MFIter **)&((BoxArray *)(local_298._64_8_ + 8))->m_bat;
          in_stack_fffffffffffffc38 = *(Box **)(local_298._64_8_ + 0x10);
          in_stack_fffffffffffffc40 = *(BoxArray **)(local_298._64_8_ + 0x18);
          std::vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::
          push_back((vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>
                     *)in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
        ::operator++(&local_340);
      }
      __gnu_cxx::
      __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
      ::operator++((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                    *)(local_32c + 0x2c));
    }
    MFIter::operator++(&local_228);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffc00);
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             in_stack_fffffffffffffc10);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffc10);
  BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffc00);
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::~Vector
            ((Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> *)
             0x1043bf4);
  return;
}

Assistant:

void makeFineMask_doit (FabArray<FAB>& mask, const BoxArray& fba,
                            const IntVect& ratio, Periodicity const& period,
                            typename FAB::value_type crse_value,
                            typename FAB::value_type fine_value)
    {
        using value_type = typename FAB::value_type;

        Vector<Array4BoxTag<value_type> > tags;

        bool run_on_gpu = Gpu::inLaunchRegion();

        const BoxArray& cfba = amrex::coarsen(fba,ratio);
        const std::vector<IntVect>& pshifts = period.shiftIntVect();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
        {
            std::vector <std::pair<int,Box> > isects;
            for (MFIter mfi(mask); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.fabbox();
                Array4<value_type> const& arr = mask.array(mfi);
                auto& fab = mask[mfi];

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    arr(i,j,k) = crse_value;
                });

                for (const auto& iv : pshifts) {
                    cfba.intersections(bx+iv, isects);
                    for (const auto& is : isects) {
                        Box const& b = is.second-iv;
                        if (run_on_gpu) {
                            tags.push_back({arr,b});
                        } else {
                            fab.template setVal<RunOn::Host>(fine_value, b);
                        }
                    }
                }
            }
        }

#ifdef AMREX_USE_GPU
        amrex::ParallelFor(tags, 1,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n,
                              Array4BoxTag<value_type> const& tag) noexcept
        {
            tag.dfab(i,j,k,n) = fine_value;
        });
#endif
    }